

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::sse2::InstanceArrayIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float (*pafVar2) [16];
  float *pfVar3;
  float *pfVar4;
  RTCFormat RVar5;
  InstanceArray *this;
  RawBufferView *pRVar6;
  char *pcVar7;
  RTCPointQueryContext *pRVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 uVar18;
  bool bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float fVar23;
  float in_XMM1_Dc;
  float fVar24;
  float in_XMM1_Dd;
  float fVar25;
  float in_XMM2_Da;
  float fVar26;
  float in_XMM2_Db;
  float fVar27;
  float in_XMM2_Dc;
  float fVar28;
  float in_XMM2_Dd;
  float fVar29;
  float in_XMM3_Da;
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  float fVar32;
  float fVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float in_XMM5_Da;
  float fVar34;
  float in_XMM5_Db;
  float fVar35;
  float in_XMM5_Dc;
  float in_XMM5_Dd;
  vfloat4 a0_1;
  vfloat4 l02;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float in_XMM7_Da;
  float fVar38;
  float in_XMM7_Db;
  float in_XMM7_Dc;
  vfloat4 a0;
  undefined1 auVar39 [16];
  float fVar41;
  undefined1 auVar40 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [12];
  float fVar49;
  undefined1 in_XMM9 [16];
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float in_XMM11_Da;
  float fVar54;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  undefined1 auVar55 [16];
  float in_XMM12_Da;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM13_Da;
  float fVar56;
  float fVar57;
  float fVar58;
  float in_XMM13_Db;
  float fVar59;
  float in_XMM13_Dc;
  float fVar60;
  float in_XMM13_Dd;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float local_108;
  float fStack_104;
  float fStack_e4;
  float fStack_c4;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  float local_98;
  Accel *local_88;
  undefined8 local_80;
  PointQuery *local_78;
  undefined4 local_70;
  PointQueryFunction local_68;
  RTCPointQueryContext *local_60;
  float local_58;
  void *local_50;
  undefined8 local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  auVar48 = in_XMM9._0_12_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  local_88 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (local_88 == (Accel *)0x0) {
    return false;
  }
  uVar21 = (ulong)prim->primID_;
  pRVar6 = (this->l2w_buf).items;
  RVar5 = pRVar6->format;
  if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
    if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = pRVar6->stride * uVar21;
      fVar32 = *(float *)(pcVar7 + lVar22 + 0x10);
      fVar38 = *(float *)(pcVar7 + lVar22);
      in_XMM13_Da = *(float *)(pcVar7 + lVar22 + 4);
      in_XMM5_Da = *(float *)(pcVar7 + lVar22 + 8);
      in_XMM11_Da = *(float *)(pcVar7 + lVar22 + 0xc);
      fVar33 = *(float *)(pcVar7 + lVar22 + 0x20);
      fVar41 = 0.0;
      in_XMM13_Db = *(float *)(pcVar7 + lVar22 + 0x14);
      in_XMM13_Dc = *(float *)(pcVar7 + lVar22 + 0x24);
      in_XMM13_Dd = 0.0;
      in_XMM5_Db = *(float *)(pcVar7 + lVar22 + 0x18);
      in_XMM5_Dc = *(float *)(pcVar7 + lVar22 + 0x28);
      in_XMM5_Dd = 0.0;
      in_XMM11_Db = *(float *)(pcVar7 + lVar22 + 0x1c);
      in_XMM11_Dc = *(float *)(pcVar7 + lVar22 + 0x2c);
      in_XMM11_Dd = 0.0;
    }
    else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = pRVar6->stride * uVar21;
      fVar32 = (float)*(undefined8 *)(pcVar7 + lVar22 + 4);
      fVar33 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 4) >> 0x20);
      fVar38 = *(float *)(pcVar7 + lVar22);
      fVar41 = 0.0;
      in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x10);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x10) >> 0x20);
      in_XMM13_Da = *(float *)(pcVar7 + lVar22 + 0xc);
      in_XMM13_Dd = 0.0;
      in_XMM5_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x1c);
      in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x1c) >> 0x20);
      in_XMM5_Da = *(float *)(pcVar7 + lVar22 + 0x18);
      in_XMM5_Dd = 0.0;
      in_XMM11_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x28);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x28) >> 0x20);
      in_XMM11_Da = *(float *)(pcVar7 + lVar22 + 0x24);
      in_XMM11_Dd = 0.0;
    }
    else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = pRVar6->stride * uVar21;
      in_XMM5_Da = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x10);
      in_XMM5_Db = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x10) >> 0x20);
      fVar32 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x34);
      fVar33 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x34) >> 0x20);
      fVar38 = *(float *)(pcVar7 + lVar22);
      in_XMM13_Db = *(float *)(pcVar7 + lVar22 + 4);
      in_XMM5_Dc = *(float *)(pcVar7 + lVar22 + 8);
      in_XMM13_Da = *(float *)(pcVar7 + lVar22 + 0xc);
      in_XMM11_Da = *(float *)(pcVar7 + lVar22 + 0x18);
      in_XMM11_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x1c);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x1c) >> 0x20);
      in_XMM11_Dd = *(float *)(pcVar7 + lVar22 + 0x24);
      fVar41 = *(float *)(pcVar7 + lVar22 + 0x28);
      in_XMM13_Dd = *(float *)(pcVar7 + lVar22 + 0x2c);
      fVar23 = *(float *)(pcVar7 + lVar22 + 0x30);
      fVar25 = fVar23 * fVar23 +
               in_XMM13_Dd * in_XMM13_Dd + in_XMM11_Dd * in_XMM11_Dd + fVar41 * fVar41;
      auVar31 = rsqrtss(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      fVar24 = auVar31._0_4_;
      in_XMM5_Dd = fVar24 * fVar24 * fVar25 * -0.5 * fVar24 + fVar24 * 1.5;
      in_XMM11_Dd = in_XMM11_Dd * in_XMM5_Dd;
      fVar41 = fVar41 * in_XMM5_Dd;
      in_XMM13_Dd = in_XMM13_Dd * in_XMM5_Dd;
      in_XMM5_Dd = in_XMM5_Dd * fVar23;
      in_XMM13_Dc = *(float *)(pcVar7 + lVar22 + 0x3c);
    }
    else {
      fVar38 = extraout_XMM0_Da;
      fVar32 = extraout_XMM0_Db;
      fVar33 = extraout_XMM0_Dc;
      fVar41 = extraout_XMM0_Dd;
      if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar22 = pRVar6->stride * uVar21;
        pfVar1 = (float *)(pcVar7 + lVar22);
        fVar38 = *pfVar1;
        fVar32 = pfVar1[1];
        fVar33 = pfVar1[2];
        fVar41 = pfVar1[3];
        pfVar1 = (float *)(pcVar7 + lVar22 + 0x10);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar7 + lVar22 + 0x20);
        in_XMM5_Da = *pfVar1;
        in_XMM5_Db = pfVar1[1];
        in_XMM5_Dc = pfVar1[2];
        in_XMM5_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar7 + lVar22 + 0x30);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
      }
    }
    fVar35 = fVar41 * in_XMM13_Dd + in_XMM5_Dd * in_XMM11_Dd;
    fVar34 = fVar41 * in_XMM13_Dd - in_XMM5_Dd * in_XMM11_Dd;
    fVar24 = in_XMM11_Dd * in_XMM11_Dd - fVar41 * fVar41;
    fVar27 = in_XMM11_Dd * in_XMM11_Dd + fVar41 * fVar41 + -in_XMM13_Dd * in_XMM13_Dd +
             -in_XMM5_Dd * in_XMM5_Dd;
    fVar25 = in_XMM13_Dd * in_XMM13_Dd + fVar24 + -in_XMM5_Dd * in_XMM5_Dd;
    fVar44 = fVar41 * in_XMM5_Dd - in_XMM13_Dd * in_XMM11_Dd;
    fVar23 = in_XMM13_Dd * in_XMM11_Dd + fVar41 * in_XMM5_Dd;
    fVar29 = in_XMM13_Dd * in_XMM5_Dd + fVar41 * in_XMM11_Dd;
    fVar41 = in_XMM13_Dd * in_XMM5_Dd - fVar41 * in_XMM11_Dd;
    fVar35 = fVar35 + fVar35;
    fVar44 = fVar44 + fVar44;
    fVar34 = fVar34 + fVar34;
    fVar29 = fVar29 + fVar29;
    fVar23 = fVar23 + fVar23;
    fVar41 = fVar41 + fVar41;
    fVar24 = in_XMM5_Dd * in_XMM5_Dd + fVar24 + -in_XMM13_Dd * in_XMM13_Dd;
    fVar28 = fVar27 * 1.0 + fVar35 * 0.0 + fVar44 * 0.0;
    fVar26 = fVar27 * 0.0 + fVar35 * 1.0 + fVar44 * 0.0;
    fVar42 = fVar27 * 0.0 + fVar35 * 0.0 + fVar44 * 1.0;
    fVar35 = fVar27 * 0.0 + fVar35 * 0.0 + fVar44 * 0.0;
    fVar43 = fVar34 * 1.0 + fVar25 * 0.0 + fVar29 * 0.0;
    fVar45 = fVar34 * 0.0 + fVar25 * 1.0 + fVar29 * 0.0;
    fVar47 = fVar34 * 0.0 + fVar25 * 0.0 + fVar29 * 1.0;
    fVar51 = fVar34 * 0.0 + fVar25 * 0.0 + fVar29 * 0.0;
    fVar29 = fVar23 * 1.0 + fVar41 * 0.0 + fVar24 * 0.0;
    fVar46 = fVar23 * 0.0 + fVar41 * 1.0 + fVar24 * 0.0;
    fStack_c4 = fVar23 * 0.0 + fVar41 * 0.0 + fVar24 * 1.0;
    fVar34 = fVar23 * 0.0 + fVar41 * 0.0 + fVar24 * 0.0;
    fVar25 = in_XMM5_Dc * fVar29;
    fVar44 = in_XMM5_Dc * fVar46;
    fStack_e4 = in_XMM5_Dc * fStack_c4;
    in_XMM5_Dc = in_XMM5_Dc * fVar34;
    local_108 = in_XMM11_Dc * fVar29;
    fStack_104 = in_XMM11_Dc * fVar46;
    fVar27 = in_XMM11_Dc * fStack_c4;
    in_XMM11_Dc = in_XMM11_Dc * fVar34;
    fVar29 = fVar29 * 0.0;
    fVar46 = fVar46 * 0.0;
    fStack_c4 = fStack_c4 * 0.0;
    fVar34 = fVar34 * 0.0;
    fVar54 = fVar43 * 0.0 + fVar29;
    fVar56 = fVar45 * 0.0 + fVar46;
    fVar49 = fVar47 * 0.0 + fStack_c4;
    fVar50 = fVar51 * 0.0 + fVar34;
    fVar57 = in_XMM13_Db * fVar43 + fVar29;
    fVar59 = in_XMM13_Db * fVar45 + fVar46;
    fVar60 = in_XMM13_Db * fVar47 + fStack_c4;
    in_XMM3_Dd = in_XMM13_Db * fVar51 + fVar34;
    fVar61 = in_XMM5_Db * fVar43 + fVar25;
    fVar62 = in_XMM5_Db * fVar45 + fVar44;
    fVar63 = in_XMM5_Db * fVar47 + fStack_e4;
    in_XMM2_Dd = in_XMM5_Db * fVar51 + in_XMM5_Dc;
    fVar43 = in_XMM11_Db * fVar43 + local_108;
    fVar45 = in_XMM11_Db * fVar45 + fStack_104;
    fVar47 = in_XMM11_Db * fVar47 + fVar27;
    fVar51 = in_XMM11_Db * fVar51 + in_XMM11_Dc;
    fVar41 = fVar38 * fVar28;
    fVar23 = fVar38 * fVar26;
    fVar24 = fVar38 * fVar42;
    fVar38 = fVar38 * fVar35;
    in_XMM3_Da = in_XMM13_Da * fVar28;
    in_XMM3_Db = in_XMM13_Da * fVar26;
    in_XMM3_Dc = in_XMM13_Da * fVar42;
    in_XMM13_Da = in_XMM13_Da * fVar35;
    in_XMM2_Da = in_XMM5_Da * fVar28;
    in_XMM2_Db = in_XMM5_Da * fVar26;
    in_XMM2_Dc = in_XMM5_Da * fVar42;
    in_XMM5_Da = in_XMM5_Da * fVar35;
    fVar64 = in_XMM11_Da * fVar28;
    fVar65 = in_XMM11_Da * fVar26;
    fVar66 = in_XMM11_Da * fVar42;
    in_XMM11_Da = in_XMM11_Da * fVar35;
    pRVar6 = (this->l2w_buf).items;
    RVar5 = pRVar6->format;
    if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      fVar44 = *(float *)(pcVar7 + lVar22 + 0x10);
      fVar25 = *(float *)(pcVar7 + lVar22);
      fVar28 = *(float *)(pcVar7 + lVar22 + 4);
      local_108 = *(float *)(pcVar7 + lVar22 + 8);
      fVar29 = *(float *)(pcVar7 + lVar22 + 0xc);
      fStack_e4 = *(float *)(pcVar7 + lVar22 + 0x20);
      in_XMM5_Dc = 0.0;
      fVar26 = *(float *)(pcVar7 + lVar22 + 0x14);
      fVar42 = *(float *)(pcVar7 + lVar22 + 0x24);
      fVar35 = 0.0;
      fStack_104 = *(float *)(pcVar7 + lVar22 + 0x18);
      fVar27 = *(float *)(pcVar7 + lVar22 + 0x28);
      in_XMM11_Dc = 0.0;
      fVar46 = *(float *)(pcVar7 + lVar22 + 0x1c);
      fStack_c4 = *(float *)(pcVar7 + lVar22 + 0x2c);
      fVar34 = 0.0;
    }
    else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      fVar25 = *(float *)(pcVar7 + lVar22);
      fVar44 = (float)*(undefined8 *)(pcVar7 + lVar22 + 4);
      fStack_e4 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 4) >> 0x20);
      in_XMM5_Dc = 0.0;
      fVar28 = *(float *)(pcVar7 + lVar22 + 0xc);
      fVar26 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x10);
      fVar42 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x10) >> 0x20);
      fVar35 = 0.0;
      local_108 = *(float *)(pcVar7 + lVar22 + 0x18);
      fStack_104 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x1c);
      fVar27 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x1c) >> 0x20);
      in_XMM11_Dc = 0.0;
      fVar29 = *(float *)(pcVar7 + lVar22 + 0x24);
      fVar46 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x28);
      fStack_c4 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x28) >> 0x20);
      fVar34 = 0.0;
    }
    else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      fVar25 = *(float *)(pcVar7 + lVar22);
      fVar26 = *(float *)(pcVar7 + lVar22 + 4);
      fVar27 = *(float *)(pcVar7 + lVar22 + 8);
      fVar28 = *(float *)(pcVar7 + lVar22 + 0xc);
      fVar44 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x34);
      fVar29 = *(float *)(pcVar7 + lVar22 + 0x18);
      fVar34 = *(float *)(pcVar7 + lVar22 + 0x24);
      in_XMM5_Dc = *(float *)(pcVar7 + lVar22 + 0x28);
      fVar35 = *(float *)(pcVar7 + lVar22 + 0x2c);
      fVar42 = *(float *)(pcVar7 + lVar22 + 0x30);
      fVar58 = fVar42 * fVar42 + fVar35 * fVar35 + fVar34 * fVar34 + in_XMM5_Dc * in_XMM5_Dc;
      auVar31 = rsqrtss(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      fVar46 = auVar31._0_4_;
      in_XMM11_Dc = fVar46 * fVar46 * fVar58 * -0.5 * fVar46 + fVar46 * 1.5;
      fVar34 = fVar34 * in_XMM11_Dc;
      in_XMM5_Dc = in_XMM5_Dc * in_XMM11_Dc;
      fVar35 = fVar35 * in_XMM11_Dc;
      in_XMM11_Dc = in_XMM11_Dc * fVar42;
      local_108 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x10);
      fStack_104 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x10) >> 0x20);
      fStack_e4 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x34) >> 0x20);
      fVar42 = *(float *)(pcVar7 + lVar22 + 0x3c);
      fStack_c4 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x1c) >> 0x20);
      fVar46 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x1c);
    }
    else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      pfVar1 = (float *)(pcVar7 + lVar22);
      fVar25 = *pfVar1;
      fVar44 = pfVar1[1];
      fStack_e4 = pfVar1[2];
      in_XMM5_Dc = pfVar1[3];
      pfVar1 = (float *)(pcVar7 + lVar22 + 0x10);
      fVar28 = *pfVar1;
      fVar26 = pfVar1[1];
      fVar42 = pfVar1[2];
      fVar35 = pfVar1[3];
      pfVar1 = (float *)(pcVar7 + lVar22 + 0x20);
      local_108 = *pfVar1;
      fStack_104 = pfVar1[1];
      fVar27 = pfVar1[2];
      in_XMM11_Dc = pfVar1[3];
      pfVar1 = (float *)(pcVar7 + lVar22 + 0x30);
      fVar29 = *pfVar1;
      fVar46 = pfVar1[1];
      fStack_c4 = pfVar1[2];
      fVar34 = pfVar1[3];
    }
    fVar41 = fVar41 + fVar54;
    fVar23 = fVar23 + fVar56;
    fVar24 = fVar24 + fVar49;
    fVar38 = fVar38 + fVar50;
    in_XMM3_Da = in_XMM3_Da + fVar57;
    in_XMM3_Db = in_XMM3_Db + fVar59;
    in_XMM3_Dc = in_XMM3_Dc + fVar60;
    in_XMM3_Dd = in_XMM13_Da + in_XMM3_Dd;
    in_XMM2_Da = in_XMM2_Da + fVar61;
    in_XMM2_Db = in_XMM2_Db + fVar62;
    in_XMM2_Dc = in_XMM2_Dc + fVar63;
    in_XMM2_Dd = in_XMM5_Da + in_XMM2_Dd;
    in_XMM1_Da = fVar32 + 0.0 + fVar64 + fVar43;
    in_XMM1_Db = fVar33 + 0.0 + fVar65 + fVar45;
    in_XMM1_Dc = in_XMM13_Dc + 0.0 + fVar66 + fVar47;
    in_XMM1_Dd = in_XMM11_Da + fVar51 + 0.0;
    fVar32 = in_XMM5_Dc * fVar35 + in_XMM11_Dc * fVar34;
    fVar45 = in_XMM5_Dc * fVar35 - in_XMM11_Dc * fVar34;
    fVar56 = fVar34 * fVar34 - in_XMM5_Dc * in_XMM5_Dc;
    fVar54 = fVar34 * fVar34 + in_XMM5_Dc * in_XMM5_Dc + -fVar35 * fVar35 +
             -in_XMM11_Dc * in_XMM11_Dc;
    fVar33 = fVar35 * fVar35 + fVar56 + -in_XMM11_Dc * in_XMM11_Dc;
    fVar47 = in_XMM5_Dc * in_XMM11_Dc - fVar35 * fVar34;
    fVar51 = fVar35 * fVar34 + in_XMM5_Dc * in_XMM11_Dc;
    fVar43 = fVar35 * in_XMM11_Dc + in_XMM5_Dc * fVar34;
    fVar34 = fVar35 * in_XMM11_Dc - in_XMM5_Dc * fVar34;
    fVar49 = in_XMM11_Dc * in_XMM11_Dc + fVar56 + -fVar35 * fVar35;
    fVar32 = fVar32 + fVar32;
    fVar47 = fVar47 + fVar47;
    fVar35 = fVar54 * 1.0 + fVar32 * 0.0 + fVar47 * 0.0;
    fVar56 = fVar54 * 0.0 + fVar32 * 1.0 + fVar47 * 0.0;
    fVar47 = fVar54 * 0.0 + fVar32 * 0.0 + fVar47 * 1.0;
    fVar43 = fVar43 + fVar43;
    fVar45 = fVar45 + fVar45;
    fVar54 = fVar45 * 1.0 + fVar33 * 0.0 + fVar43 * 0.0;
    fVar50 = fVar45 * 0.0 + fVar33 * 1.0 + fVar43 * 0.0;
    fVar43 = fVar45 * 0.0 + fVar33 * 0.0 + fVar43 * 1.0;
    fVar51 = fVar51 + fVar51;
    fVar34 = fVar34 + fVar34;
    fVar32 = fVar51 * 1.0 + fVar34 * 0.0 + fVar49 * 0.0;
    fVar33 = fVar51 * 0.0 + fVar34 * 1.0 + fVar49 * 0.0;
    fVar34 = fVar51 * 0.0 + fVar34 * 0.0 + fVar49 * 1.0;
    in_XMM5_Da = fVar25 * fVar35 + fVar54 * 0.0 + fVar32 * 0.0;
    in_XMM5_Db = fVar25 * fVar56 + fVar50 * 0.0 + fVar33 * 0.0;
    in_XMM5_Dc = fVar25 * fVar47 + fVar43 * 0.0 + fVar34 * 0.0;
    in_XMM7_Da = fVar28 * fVar35 + fVar26 * fVar54 + fVar32 * 0.0;
    in_XMM7_Db = fVar28 * fVar56 + fVar26 * fVar50 + fVar33 * 0.0;
    in_XMM7_Dc = fVar28 * fVar47 + fVar26 * fVar43 + fVar34 * 0.0;
    in_XMM12_Da = local_108 * fVar35 + fStack_104 * fVar54 + fVar27 * fVar32;
    in_XMM12_Db = local_108 * fVar56 + fStack_104 * fVar50 + fVar27 * fVar33;
    in_XMM12_Dc = local_108 * fVar47 + fStack_104 * fVar43 + fVar27 * fVar34;
    auVar48._0_4_ = fVar29 * fVar35 + fVar46 * fVar54 + fStack_c4 * fVar32 + fVar44 + 0.0;
    auVar48._4_4_ = fVar29 * fVar56 + fVar46 * fVar50 + fStack_c4 * fVar33 + fStack_e4 + 0.0;
    auVar48._8_4_ = fVar29 * fVar47 + fVar46 * fVar43 + fStack_c4 * fVar34 + fVar42 + 0.0;
  }
  else {
    if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      fVar23 = *(float *)(pcVar7 + lVar22 + 0x10);
      fVar41 = *(float *)(pcVar7 + lVar22);
      in_XMM3_Da = *(float *)(pcVar7 + lVar22 + 4);
      in_XMM2_Da = *(float *)(pcVar7 + lVar22 + 8);
      in_XMM1_Da = *(float *)(pcVar7 + lVar22 + 0xc);
      fVar24 = *(float *)(pcVar7 + lVar22 + 0x20);
      fVar38 = 0.0;
      in_XMM3_Db = *(float *)(pcVar7 + lVar22 + 0x14);
      in_XMM3_Dc = *(float *)(pcVar7 + lVar22 + 0x24);
      in_XMM3_Dd = 0.0;
      in_XMM2_Db = *(float *)(pcVar7 + lVar22 + 0x18);
      in_XMM2_Dc = *(float *)(pcVar7 + lVar22 + 0x28);
      in_XMM2_Dd = 0.0;
      in_XMM1_Db = *(float *)(pcVar7 + lVar22 + 0x1c);
      in_XMM1_Dc = *(float *)(pcVar7 + lVar22 + 0x2c);
      in_XMM1_Dd = 0.0;
    }
    else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      fVar23 = (float)*(undefined8 *)(pcVar7 + lVar22 + 4);
      fVar24 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 4) >> 0x20);
      fVar41 = *(float *)(pcVar7 + lVar22);
      fVar38 = 0.0;
      in_XMM3_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x10);
      in_XMM3_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x10) >> 0x20);
      in_XMM3_Da = *(float *)(pcVar7 + lVar22 + 0xc);
      in_XMM3_Dd = 0.0;
      in_XMM2_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x1c);
      in_XMM2_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x1c) >> 0x20);
      in_XMM2_Da = *(float *)(pcVar7 + lVar22 + 0x18);
      in_XMM2_Dd = 0.0;
      in_XMM1_Da = *(float *)(pcVar7 + lVar22 + 0x24);
      in_XMM1_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x28);
      in_XMM1_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x28) >> 0x20);
      in_XMM1_Dd = 0.0;
    }
    else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      in_XMM2_Da = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x10);
      in_XMM2_Db = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x10) >> 0x20);
      fVar41 = *(float *)(pcVar7 + lVar22);
      in_XMM3_Db = *(float *)(pcVar7 + lVar22 + 4);
      in_XMM2_Dc = *(float *)(pcVar7 + lVar22 + 8);
      in_XMM3_Da = *(float *)(pcVar7 + lVar22 + 0xc);
      fVar23 = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x34);
      fVar24 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x34) >> 0x20);
      in_XMM1_Da = *(float *)(pcVar7 + lVar22 + 0x18);
      in_XMM1_Db = (float)*(undefined8 *)(pcVar7 + lVar22 + 0x1c);
      in_XMM1_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar22 + 0x1c) >> 0x20);
      in_XMM1_Dd = *(float *)(pcVar7 + lVar22 + 0x24);
      fVar38 = *(float *)(pcVar7 + lVar22 + 0x28);
      in_XMM3_Dd = *(float *)(pcVar7 + lVar22 + 0x2c);
      fVar32 = *(float *)(pcVar7 + lVar22 + 0x30);
      fVar25 = fVar32 * fVar32 + in_XMM3_Dd * in_XMM3_Dd + in_XMM1_Dd * in_XMM1_Dd + fVar38 * fVar38
      ;
      auVar31 = rsqrtss(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      fVar33 = auVar31._0_4_;
      in_XMM2_Dd = fVar33 * fVar33 * fVar25 * -0.5 * fVar33 + fVar33 * 1.5;
      in_XMM1_Dd = in_XMM1_Dd * in_XMM2_Dd;
      fVar38 = fVar38 * in_XMM2_Dd;
      in_XMM3_Dd = in_XMM3_Dd * in_XMM2_Dd;
      in_XMM2_Dd = in_XMM2_Dd * fVar32;
      in_XMM3_Dc = *(float *)(pcVar7 + lVar22 + 0x3c);
    }
    else {
      fVar41 = extraout_XMM0_Da;
      fVar23 = extraout_XMM0_Db;
      fVar24 = extraout_XMM0_Dc;
      fVar38 = extraout_XMM0_Dd;
      if (RVar5 != RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) goto LAB_0027615e;
      pcVar7 = pRVar6->ptr_ofs;
      lVar22 = uVar21 * pRVar6->stride;
      pfVar1 = (float *)(pcVar7 + lVar22);
      fVar41 = *pfVar1;
      fVar23 = pfVar1[1];
      fVar24 = pfVar1[2];
      fVar38 = pfVar1[3];
      pfVar1 = (float *)(pcVar7 + lVar22 + 0x10);
      in_XMM3_Da = *pfVar1;
      in_XMM3_Db = pfVar1[1];
      in_XMM3_Dc = pfVar1[2];
      in_XMM3_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar7 + lVar22 + 0x20);
      in_XMM2_Da = *pfVar1;
      in_XMM2_Db = pfVar1[1];
      in_XMM2_Dc = pfVar1[2];
      in_XMM2_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar7 + lVar22 + 0x30);
      in_XMM1_Da = *pfVar1;
      in_XMM1_Db = pfVar1[1];
      in_XMM1_Dc = pfVar1[2];
      in_XMM1_Dd = pfVar1[3];
    }
    auVar48._4_4_ = in_XMM1_Db;
    auVar48._0_4_ = in_XMM1_Da;
    auVar48._8_4_ = in_XMM1_Dc;
    in_XMM5_Da = fVar41;
    in_XMM5_Db = fVar23;
    in_XMM5_Dc = fVar24;
    in_XMM12_Da = in_XMM2_Da;
    in_XMM12_Db = in_XMM2_Db;
    in_XMM12_Dc = in_XMM2_Dc;
    in_XMM7_Da = in_XMM3_Da;
    in_XMM7_Db = in_XMM3_Db;
    in_XMM7_Dc = in_XMM3_Dc;
  }
LAB_0027615e:
  auVar30._0_4_ = in_XMM7_Da * in_XMM12_Db - in_XMM12_Da * in_XMM7_Db;
  fVar32 = in_XMM7_Db * in_XMM12_Dc - in_XMM12_Db * in_XMM7_Dc;
  fVar33 = in_XMM7_Dc * in_XMM12_Da - in_XMM12_Dc * in_XMM7_Da;
  auVar30._4_4_ = in_XMM12_Da * in_XMM5_Db - in_XMM12_Db * in_XMM5_Da;
  auVar30._8_4_ = in_XMM7_Db * in_XMM5_Da - in_XMM5_Db * in_XMM7_Da;
  auVar30._12_4_ = 0;
  auVar39._4_4_ = in_XMM12_Db * in_XMM5_Dc - in_XMM12_Dc * in_XMM5_Db;
  auVar39._0_4_ = fVar32;
  auVar39._8_4_ = in_XMM7_Dc * in_XMM5_Db - in_XMM5_Dc * in_XMM7_Db;
  auVar39._12_4_ = 0;
  auVar36._4_4_ = in_XMM12_Dc * in_XMM5_Da - in_XMM12_Da * in_XMM5_Dc;
  auVar36._0_4_ = fVar33;
  auVar36._8_4_ = in_XMM7_Da * in_XMM5_Dc - in_XMM5_Da * in_XMM7_Dc;
  auVar36._12_4_ = 0;
  fVar32 = in_XMM5_Dc * auVar30._0_4_ + in_XMM5_Db * fVar33 + in_XMM5_Da * fVar32;
  auVar31._4_4_ = fVar32;
  auVar31._0_4_ = fVar32;
  auVar31._8_4_ = fVar32;
  auVar31._12_4_ = fVar32;
  auVar39 = divps(auVar39,auVar31);
  auVar37._4_4_ = fVar32;
  auVar37._0_4_ = fVar32;
  auVar37._8_4_ = fVar32;
  auVar37._12_4_ = fVar32;
  auVar37 = divps(auVar36,auVar37);
  auVar13._4_4_ = fVar32;
  auVar13._0_4_ = fVar32;
  auVar13._8_4_ = fVar32;
  auVar13._12_4_ = fVar32;
  auVar31 = divps(auVar30,auVar13);
  fVar43 = auVar48._0_4_;
  fVar45 = auVar48._4_4_;
  fVar47 = auVar48._8_4_;
  fVar32 = auVar31._0_4_;
  fVar33 = auVar31._4_4_;
  fVar25 = auVar31._8_4_;
  fVar26 = auVar37._0_4_;
  fVar27 = auVar37._4_4_;
  fVar28 = auVar37._8_4_;
  fVar29 = auVar39._0_4_;
  fVar34 = auVar39._4_4_;
  fVar35 = auVar39._8_4_;
  fVar42 = fVar43 * fVar29 + fVar45 * fVar26 + fVar47 * fVar32;
  fVar44 = fVar43 * fVar34 + fVar45 * fVar27 + fVar47 * fVar33;
  fVar46 = fVar43 * fVar35 + fVar45 * fVar28 + fVar47 * fVar25;
  local_70 = 2;
  bVar19 = true;
  local_58 = 0.0;
  if ((((context->query_type == POINT_QUERY_TYPE_SPHERE) &&
       (ABS(fVar35 * fVar28 + fVar34 * fVar27 + fVar29 * fVar26) <= 1e-05)) &&
      (ABS(fVar35 * fVar25 + fVar34 * fVar33 + fVar29 * fVar32) <= 1e-05)) &&
     (ABS(fVar28 * fVar25 + fVar27 * fVar33 + fVar26 * fVar32) <= 1e-05)) {
    fVar51 = fVar35 * fVar35 + fVar34 * fVar34 + fVar29 * fVar29;
    fVar54 = fVar28 * fVar28 + fVar27 * fVar27 + fVar26 * fVar26;
    if (((ABS(fVar51 - fVar54) <= 1e-05) &&
        (fVar56 = fVar25 * fVar25 + fVar33 * fVar33 + fVar32 * fVar32, ABS(fVar51 - fVar56) <= 1e-05
        )) && (ABS(fVar54 - fVar56) <= 1e-05)) {
      local_58 = SQRT(fVar51);
      local_70 = 1;
      bVar19 = false;
    }
  }
  pRVar8 = context->userContext;
  uVar20 = pRVar8->instStackSize;
  *(ulong *)(pRVar8->instID + uVar20) = CONCAT44((*prim).primID_,(*prim).instID_);
  *(undefined1 (*) [16])pRVar8->world2inst[uVar20] = auVar39;
  *(undefined1 (*) [16])(pRVar8->world2inst[uVar20] + 4) = auVar37;
  *(undefined1 (*) [16])(pRVar8->world2inst[uVar20] + 8) = auVar31;
  pfVar1 = pRVar8->world2inst[uVar20] + 0xc;
  *pfVar1 = -fVar42;
  pfVar1[1] = -fVar44;
  pfVar1[2] = -fVar46;
  pfVar1[3] = -(fVar43 * auVar39._12_4_ + fVar45 * auVar37._12_4_ + fVar47 * auVar31._12_4_);
  pafVar2 = pRVar8->inst2world + uVar20;
  (*pafVar2)[0] = fVar41;
  (*pafVar2)[1] = fVar23;
  (*pafVar2)[2] = fVar24;
  (*pafVar2)[3] = fVar38;
  pfVar1 = pRVar8->inst2world[uVar20] + 4;
  *pfVar1 = in_XMM3_Da;
  pfVar1[1] = in_XMM3_Db;
  pfVar1[2] = in_XMM3_Dc;
  pfVar1[3] = in_XMM3_Dd;
  pfVar1 = pRVar8->inst2world[uVar20] + 8;
  *pfVar1 = in_XMM2_Da;
  pfVar1[1] = in_XMM2_Db;
  pfVar1[2] = in_XMM2_Dc;
  pfVar1[3] = in_XMM2_Dd;
  pfVar1 = pRVar8->inst2world[uVar20] + 0xc;
  *pfVar1 = in_XMM1_Da;
  pfVar1[1] = in_XMM1_Db;
  pfVar1[2] = in_XMM1_Dc;
  pfVar1[3] = in_XMM1_Dd;
  pRVar8->instStackSize = pRVar8->instStackSize + 1;
  local_9c = query->time;
  fVar38 = (query->p).field_0.field_0.x;
  fVar41 = (query->p).field_0.field_0.y;
  fVar23 = (query->p).field_0.field_0.z;
  local_a0 = fVar38 * fVar35 + fVar41 * fVar28 + (fVar23 * fVar25 - fVar46);
  local_a8 = CONCAT44(fVar38 * fVar34 + fVar41 * fVar27 + (fVar23 * fVar33 - fVar44),
                      fVar38 * fVar29 + fVar41 * fVar26 + (fVar23 * fVar32 - fVar42));
  local_98 = query->radius * local_58;
  local_78 = context->query_ws;
  local_68 = context->func;
  local_60 = context->userContext;
  local_50 = context->userPtr;
  local_80 = 0;
  local_48 = 0xffffffffffffffff;
  local_38 = local_78->radius;
  if (bVar19) {
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
    if ((local_38 < INFINITY) && (local_60->instStackSize != 0)) {
      uVar20 = local_60->instStackSize - 1;
      pafVar2 = local_60->world2inst + uVar20;
      pfVar1 = local_60->world2inst[uVar20] + 4;
      pfVar3 = local_60->world2inst[uVar20] + 8;
      pfVar4 = local_60->world2inst[uVar20] + 0xc;
      fVar26 = *pfVar4 - *pfVar3 * local_38;
      fVar27 = pfVar4[1] - pfVar3[1] * local_38;
      fVar28 = pfVar4[2] - pfVar3[2] * local_38;
      fVar29 = pfVar4[3] - pfVar3[3] * local_38;
      fVar34 = -local_38 * *pfVar1;
      fVar35 = -local_38 * pfVar1[1];
      fVar42 = -local_38 * pfVar1[2];
      fVar44 = -local_38 * pfVar1[3];
      fVar43 = fVar34 + fVar26;
      fVar45 = fVar35 + fVar27;
      fVar47 = fVar42 + fVar28;
      fVar51 = fVar44 + fVar29;
      fVar38 = -local_38 * (*pafVar2)[0];
      fVar41 = -local_38 * (*pafVar2)[1];
      fVar32 = -local_38 * (*pafVar2)[2];
      fVar46 = -local_38 * (*pafVar2)[3];
      auVar55._0_4_ = fVar38 + fVar43;
      auVar55._4_4_ = fVar41 + fVar45;
      auVar55._8_4_ = fVar32 + fVar47;
      auVar55._12_4_ = fVar46 + fVar51;
      auVar31 = minps(_DAT_01f45a30,auVar55);
      auVar37 = maxps(_DAT_01f45a40,auVar55);
      fVar54 = *pfVar3 * local_38 + *pfVar4;
      fVar56 = pfVar3[1] * local_38 + pfVar4[1];
      fVar49 = pfVar3[2] * local_38 + pfVar4[2];
      fVar50 = pfVar3[3] * local_38 + pfVar4[3];
      fVar34 = fVar34 + fVar54;
      fVar35 = fVar35 + fVar56;
      fVar42 = fVar42 + fVar49;
      fVar44 = fVar44 + fVar50;
      auVar52._0_4_ = fVar38 + fVar34;
      auVar52._4_4_ = fVar41 + fVar35;
      auVar52._8_4_ = fVar32 + fVar42;
      auVar52._12_4_ = fVar46 + fVar44;
      auVar31 = minps(auVar31,auVar52);
      auVar37 = maxps(auVar37,auVar52);
      fVar33 = *pfVar1 * local_38;
      fVar23 = pfVar1[1] * local_38;
      fVar24 = pfVar1[2] * local_38;
      fVar25 = pfVar1[3] * local_38;
      fVar26 = fVar26 + fVar33;
      fVar27 = fVar27 + fVar23;
      fVar28 = fVar28 + fVar24;
      fVar29 = fVar29 + fVar25;
      auVar53._0_4_ = fVar38 + fVar26;
      auVar53._4_4_ = fVar41 + fVar27;
      auVar53._8_4_ = fVar32 + fVar28;
      auVar53._12_4_ = fVar46 + fVar29;
      auVar31 = minps(auVar31,auVar53);
      auVar37 = maxps(auVar37,auVar53);
      fVar33 = fVar33 + fVar54;
      fVar23 = fVar23 + fVar56;
      fVar24 = fVar24 + fVar49;
      fVar25 = fVar25 + fVar50;
      auVar40._0_4_ = fVar38 + fVar33;
      auVar40._4_4_ = fVar41 + fVar23;
      auVar40._8_4_ = fVar32 + fVar24;
      auVar40._12_4_ = fVar46 + fVar25;
      auVar31 = minps(auVar31,auVar40);
      auVar37 = maxps(auVar37,auVar40);
      fVar38 = local_38 * (*pafVar2)[0];
      fVar41 = local_38 * (*pafVar2)[1];
      fVar32 = local_38 * (*pafVar2)[2];
      local_38 = local_38 * (*pafVar2)[3];
      fVar43 = fVar43 + fVar38;
      fVar45 = fVar45 + fVar41;
      fVar47 = fVar47 + fVar32;
      fVar51 = fVar51 + local_38;
      auVar16._4_4_ = fVar45;
      auVar16._0_4_ = fVar43;
      auVar16._8_4_ = fVar47;
      auVar16._12_4_ = fVar51;
      auVar31 = minps(auVar31,auVar16);
      auVar17._4_4_ = fVar45;
      auVar17._0_4_ = fVar43;
      auVar17._8_4_ = fVar47;
      auVar17._12_4_ = fVar51;
      auVar37 = maxps(auVar37,auVar17);
      fVar34 = fVar34 + fVar38;
      fVar35 = fVar35 + fVar41;
      fVar42 = fVar42 + fVar32;
      fVar44 = fVar44 + local_38;
      auVar14._4_4_ = fVar35;
      auVar14._0_4_ = fVar34;
      auVar14._8_4_ = fVar42;
      auVar14._12_4_ = fVar44;
      auVar31 = minps(auVar31,auVar14);
      auVar15._4_4_ = fVar35;
      auVar15._0_4_ = fVar34;
      auVar15._8_4_ = fVar42;
      auVar15._12_4_ = fVar44;
      auVar37 = maxps(auVar37,auVar15);
      fVar26 = fVar26 + fVar38;
      fVar27 = fVar27 + fVar41;
      fVar28 = fVar28 + fVar32;
      fVar29 = fVar29 + local_38;
      auVar11._4_4_ = fVar27;
      auVar11._0_4_ = fVar26;
      auVar11._8_4_ = fVar28;
      auVar11._12_4_ = fVar29;
      auVar31 = minps(auVar31,auVar11);
      auVar12._4_4_ = fVar27;
      auVar12._0_4_ = fVar26;
      auVar12._8_4_ = fVar28;
      auVar12._12_4_ = fVar29;
      auVar37 = maxps(auVar37,auVar12);
      fVar38 = fVar38 + fVar33;
      fVar41 = fVar41 + fVar23;
      fVar32 = fVar32 + fVar24;
      local_38 = local_38 + fVar25;
      auVar9._4_4_ = fVar41;
      auVar9._0_4_ = fVar38;
      auVar9._8_4_ = fVar32;
      auVar9._12_4_ = local_38;
      auVar31 = minps(auVar31,auVar9);
      auVar10._4_4_ = fVar41;
      auVar10._0_4_ = fVar38;
      auVar10._8_4_ = fVar32;
      auVar10._12_4_ = local_38;
      auVar37 = maxps(auVar37,auVar10);
      local_38 = (auVar37._0_4_ - auVar31._0_4_) * 0.5;
      fStack_34 = (auVar37._4_4_ - auVar31._4_4_) * 0.5;
      fStack_30 = (auVar37._8_4_ - auVar31._8_4_) * 0.5;
      fStack_2c = (auVar37._12_4_ - auVar31._12_4_) * 0.5;
    }
  }
  else {
    local_38 = local_58 * local_38;
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
  }
  uVar18 = (**(code **)&local_88->field_0x88)(&(local_88->super_AccelData).field_0x58,&local_a8);
  pRVar8 = context->userContext;
  uVar20 = pRVar8->instStackSize - 1;
  pRVar8->instStackSize = uVar20;
  pRVar8->instID[uVar20] = 0xffffffff;
  pRVar8->instPrimID[pRVar8->instStackSize] = 0xffffffff;
  return (bool)uVar18;
}

Assistant:

bool InstanceArrayIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }